

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftcalc.c
# Opt level: O2

FT_Long FT_DivFix(FT_Long a_,FT_Long b_)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  
  if (b_ == 0) {
    uVar1 = 0x7fffffff;
  }
  else {
    uVar1 = -b_;
    if (0 < b_) {
      uVar1 = b_;
    }
    lVar3 = -a_;
    if (0 < a_) {
      lVar3 = a_;
    }
    uVar1 = ((uVar1 >> 1) + lVar3 * 0x10000) / uVar1;
  }
  uVar2 = -uVar1;
  if (-1 < (b_ ^ a_)) {
    uVar2 = uVar1;
  }
  return uVar2;
}

Assistant:

FT_EXPORT_DEF( FT_Long )
  FT_DivFix( FT_Long  a_,
             FT_Long  b_ )
  {
    FT_Int     s = 1;
    FT_UInt64  a, b, q;
    FT_Long    q_;


    a = (FT_UInt64)a_;
    b = (FT_UInt64)b_;

    FT_MOVE_SIGN( a_, a, s );
    FT_MOVE_SIGN( b_, b, s );

    q = b > 0 ? ( ( a << 16 ) + ( b >> 1 ) ) / b
              : 0x7FFFFFFFUL;

    q_ = (FT_Long)q;

    return s < 0 ? NEG_LONG( q_ ) : q_;
  }